

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall V4L2Device::set_format(V4L2Device *this)

{
  int iVar1;
  Writer *pWVar2;
  int *piVar3;
  bool bVar4;
  bool ok;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  bool *local_150;
  void *local_148;
  char *local_140;
  VerboseLevel local_138;
  Logger *local_130;
  bool local_128;
  Logger *local_120;
  char *local_118;
  DispatchAction local_110;
  pointer local_108;
  pointer pbStack_100;
  pointer local_f8;
  v4l2_format format;
  
  bVar4 = false;
  memset(&format,0,0xd0);
  format.type = 1;
  format.fmt.pix.pixelformat = 0x47504a4d;
  parse_resolution((V4L2Device *)local_170);
  local_160._0_8_ = (long)&format.fmt + 4;
  local_150 = &ok;
  local_160._8_8_ = &format.fmt;
  std::tuple<bool&,unsigned_int&,unsigned_int&>::operator=
            ((tuple<bool&,unsigned_int&,unsigned_int&> *)local_160,
             (tuple<bool,_unsigned_int,_unsigned_int> *)local_170);
  if (ok == true) {
    iVar1 = ioctl(this->fd,0xc0d05605,&format);
    bVar4 = true;
    if (iVar1 < 0) {
      local_160._0_8_ = &PTR__Writer_00176078;
      local_160._8_2_ = 0x10;
      local_150 = (bool *)0x15f235;
      local_148 = (void *)0x153;
      local_140 = "bool V4L2Device::set_format()";
      local_138 = 0;
      local_130 = (Logger *)0x0;
      local_128 = false;
      local_120 = (Logger *)0x0;
      local_118 = "";
      local_110 = NormalLog;
      local_108 = (pointer)0x0;
      pbStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      pWVar2 = el::base::Writer::construct((Writer *)local_160,1,"default");
      pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [22])"VIDIOC_S_FMT failed: ");
      piVar3 = __errno_location();
      local_170._0_8_ = strerror(*piVar3);
      el::base::Writer::operator<<(pWVar2,(char **)local_170);
      el::base::Writer::~Writer((Writer *)local_160);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool
    set_format()
    {
        struct v4l2_format format;
        std::memset(&format, 0, sizeof(format));

        format.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        format.fmt.pix.pixelformat = V4L2_PIX_FMT_MJPEG;
        bool ok;

        std::tie(ok, format.fmt.pix.width, format.fmt.pix.height) = parse_resolution();

        if (not ok) {
            return false;
        }

        if (ioctl(fd, VIDIOC_S_FMT, &format) < 0) {
            LOG(ERROR) << "VIDIOC_S_FMT failed: " << strerror(errno);
            return false;
        }

        return true;
    }